

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<TraceEnum::EnumValue>::relocate
          (QArrayDataPointer<TraceEnum::EnumValue> *this,qsizetype offset,EnumValue **data)

{
  bool bVar1;
  EnumValue *in_RDX;
  long in_RSI;
  EnumValue *in_RDI;
  EnumValue **unaff_retaddr;
  EnumValue *res;
  char16_t *n;
  EnumValue *c;
  
  n = (in_RDI->name).d.ptr + in_RSI * 0x10;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<TraceEnum::EnumValue,long_long>(in_RDX,(longlong)n,in_RDI);
  if ((in_RDX != (EnumValue *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<TraceEnum::EnumValue>,TraceEnum::EnumValue_const*>
                        (unaff_retaddr,(QArrayDataPointer<TraceEnum::EnumValue> *)c), bVar1)) {
    (in_RDX->name).d.d = (in_RDX->name).d.d + in_RSI * 2;
  }
  (in_RDI->name).d.ptr = n;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }